

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfPizCompressor.cpp
# Opt level: O2

int __thiscall
Imf_2_5::PizCompressor::compress
          (PizCompressor *this,char *inPtr,int inSize,Box2i *range,char **outPtr)

{
  long *plVar1;
  ushort uVar2;
  unsigned_short *puVar3;
  char *pcVar4;
  size_t __n;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  const_iterator cVar9;
  ConstIterator CVar10;
  uint uVar11;
  ulong uVar12;
  unsigned_short uVar13;
  int b;
  int j;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ChannelData *pCVar18;
  unsigned_short uVar19;
  int i_1;
  long lVar20;
  long lVar21;
  int i;
  ulong uVar22;
  unsigned_short *local_78;
  char *buf;
  AutoArray<unsigned_char,_8192> bitmap;
  AutoArray<unsigned_short,_65536> lut;
  char *inPtr_local;
  int local_44;
  char **local_40;
  char *lengthPtr;
  
  if (inSize == 0) {
    *outPtr = this->_outBuffer;
    return 0;
  }
  iVar7 = (range->min).x;
  iVar8 = (range->min).y;
  iVar5 = (range->max).x;
  iVar6 = (range->max).y;
  b = this->_maxY;
  if (iVar6 < this->_maxY) {
    b = iVar6;
  }
  local_44 = this->_maxX;
  if (iVar5 < this->_maxX) {
    local_44 = iVar5;
  }
  local_78 = this->_tmpBuffer;
  inPtr_local = inPtr;
  local_40 = outPtr;
  cVar9._M_node = (_Base_ptr)ChannelList::begin(this->_channels);
  lVar20 = 0x1c;
  while (CVar10 = ChannelList::end(this->_channels),
        (const_iterator)cVar9._M_node != CVar10._i._M_node) {
    pCVar18 = this->_channelData;
    *(unsigned_short **)((long)pCVar18 + lVar20 + -0x1c) = local_78;
    *(unsigned_short **)((long)pCVar18 + lVar20 + -0x14) = local_78;
    iVar5 = numSamples(*(int *)&cVar9._M_node[9].field_0x4,iVar7,local_44);
    *(int *)((long)pCVar18 + lVar20 + -0xc) = iVar5;
    iVar5 = numSamples(*(int *)&cVar9._M_node[9]._M_parent,iVar8,b);
    *(int *)((long)pCVar18 + lVar20 + -8) = iVar5;
    *(undefined4 *)((long)pCVar18 + lVar20 + -4) = *(undefined4 *)&cVar9._M_node[9]._M_parent;
    iVar5 = pixelTypeSize(cVar9._M_node[9]._M_color);
    iVar6 = pixelTypeSize(HALF);
    *(int *)((long)&pCVar18->start + lVar20) = iVar5 / iVar6;
    local_78 = local_78 +
               (iVar5 / iVar6) * *(int *)((long)pCVar18 + lVar20 + -0xc) *
               *(int *)((long)pCVar18 + lVar20 + -8);
    cVar9._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar9._M_node);
    lVar20 = lVar20 + 0x20;
  }
  if (this->_format == XDR) {
    for (; iVar8 <= b; iVar8 = iVar8 + 1) {
      for (lVar20 = 0; lVar20 < this->_numChans; lVar20 = lVar20 + 1) {
        pCVar18 = this->_channelData;
        iVar7 = Imath_2_5::modp(iVar8,pCVar18[lVar20].ys);
        if (iVar7 == 0) {
          for (iVar7 = pCVar18[lVar20].size * pCVar18[lVar20].nx; 0 < iVar7; iVar7 = iVar7 + -1) {
            Xdr::read<Imf_2_5::CharPtrIO,char_const*>(&inPtr_local,pCVar18[lVar20].end);
            pCVar18[lVar20].end = pCVar18[lVar20].end + 1;
          }
        }
      }
    }
  }
  else {
    for (; iVar8 <= b; iVar8 = iVar8 + 1) {
      lVar20 = 8;
      for (lVar14 = 0; lVar14 < this->_numChans; lVar14 = lVar14 + 1) {
        pCVar18 = this->_channelData;
        iVar7 = Imath_2_5::modp(iVar8,*(int *)((long)&pCVar18->nx + lVar20));
        pcVar4 = inPtr_local;
        if (iVar7 == 0) {
          lVar21 = (long)*(int *)((long)&pCVar18->ny + lVar20) *
                   (long)*(int *)((long)&pCVar18->end + lVar20);
          __n = lVar21 * 2;
          memcpy(*(void **)((long)&pCVar18->start + lVar20),inPtr_local,__n);
          inPtr_local = pcVar4 + lVar21 * 2;
          plVar1 = (long *)((long)&pCVar18->start + lVar20);
          *plVar1 = *plVar1 + __n;
        }
        lVar20 = lVar20 + 0x20;
      }
    }
  }
  AutoArray<unsigned_char,_8192>::AutoArray(&bitmap);
  puVar3 = this->_tmpBuffer;
  uVar15 = (ulong)((long)local_78 - (long)puVar3) >> 1;
  for (lVar20 = 0; lVar20 != 0x2000; lVar20 = lVar20 + 1) {
    bitmap._data[lVar20] = '\0';
  }
  uVar16 = 0;
  uVar12 = uVar15 & 0xffffffff;
  if ((int)uVar15 < 1) {
    uVar12 = uVar16;
  }
  for (; uVar12 != uVar16; uVar16 = uVar16 + 1) {
    uVar2 = puVar3[uVar16];
    bitmap._data[uVar2 >> 3] = bitmap._data[uVar2 >> 3] | (byte)(1 << ((byte)uVar2 & 7));
  }
  *bitmap._data = *bitmap._data & 0xfe;
  uVar15 = 0x1fff;
  uVar22 = 0;
  uVar12 = 0;
  uVar16 = 0;
  while( true ) {
    uVar17 = uVar15 & 0xffff;
    if (uVar16 == 0x2000) break;
    if (bitmap._data[uVar16] != '\0') {
      uVar15 = uVar17;
      if (uVar16 < uVar17) {
        uVar15 = uVar16 & 0xffffffff;
      }
      uVar11 = (uint)uVar12;
      if (uVar16 < uVar17) {
        uVar11 = (uint)uVar22;
      }
      if ((ushort)uVar11 < uVar16) {
        uVar22 = uVar16 & 0xffffffff;
      }
      uVar12 = (ulong)uVar11;
      if ((ushort)uVar11 < uVar16) {
        uVar12 = uVar16 & 0xffffffff;
      }
    }
    uVar16 = uVar16 + 1;
  }
  AutoArray<unsigned_short,_65536>::AutoArray(&lut);
  uVar12 = 0;
  uVar19 = 0;
  do {
    if (uVar12 == 0) {
LAB_003e05eb:
      uVar13 = uVar19;
      uVar19 = uVar19 + 1;
    }
    else {
      if (uVar12 == 0x10000) {
        anon_unknown_0::applyLut
                  (lut._data,this->_tmpBuffer,
                   (int)((ulong)((long)local_78 - (long)this->_tmpBuffer) >> 1));
        buf = this->_outBuffer;
        Xdr::write<Imf_2_5::CharPtrIO,char*>(&buf,(ushort)uVar15);
        Xdr::write<Imf_2_5::CharPtrIO,char*>(&buf,(ushort)uVar22);
        if ((ushort)uVar15 <= (ushort)uVar22) {
          CharPtrIO::writeChars
                    (&buf,(char *)(bitmap._data + uVar17),
                     (((uint)uVar22 & 0xffff) - (int)uVar17) + 1);
        }
        for (lVar20 = 0; lVar20 < this->_numChans; lVar20 = lVar20 + 1) {
          pCVar18 = this->_channelData + lVar20;
          lVar21 = 0;
          for (lVar14 = 0; iVar7 = pCVar18->size, lVar14 < iVar7; lVar14 = lVar14 + 1) {
            wav2Encode((unsigned_short *)((long)pCVar18->start + lVar21),pCVar18->nx,iVar7,
                       pCVar18->ny,pCVar18->nx * iVar7,uVar19 - 1);
            lVar21 = lVar21 + 2;
          }
        }
        lengthPtr = buf;
        Xdr::write<Imf_2_5::CharPtrIO,char*>(&buf,0);
        iVar7 = hufCompress(this->_tmpBuffer,
                            (int)((ulong)((long)local_78 - (long)this->_tmpBuffer) >> 1),buf);
        Xdr::write<Imf_2_5::CharPtrIO,char*>(&lengthPtr,iVar7);
        pcVar4 = this->_outBuffer;
        *local_40 = pcVar4;
        iVar8 = (int)buf - (int)pcVar4;
        AutoArray<unsigned_short,_65536>::~AutoArray(&lut);
        AutoArray<unsigned_char,_8192>::~AutoArray(&bitmap);
        return iVar7 + iVar8;
      }
      if ((bitmap._data[uVar12 >> 3 & 0x1fffffff] >> ((uint)uVar12 & 7) & 1) != 0)
      goto LAB_003e05eb;
      uVar13 = 0;
    }
    lut._data[uVar12] = uVar13;
    uVar12 = uVar12 + 1;
  } while( true );
}

Assistant:

int
PizCompressor::compress (const char *inPtr,
			 int inSize,
			 IMATH_NAMESPACE::Box2i range,
			 const char *&outPtr)
{
    //
    // This is the compress function which is used by both the tiled and
    // scanline compression routines.
    //

    //
    // Special case �- empty input buffer
    //

    if (inSize == 0)
    {
	outPtr = _outBuffer;
	return 0;
    }

    //
    // Rearrange the pixel data so that the wavelet
    // and Huffman encoders can process them easily.
    //
    // The wavelet and Huffman encoders both handle only
    // 16-bit data, so 32-bit data must be split into smaller
    // pieces.  We treat each 32-bit channel (UINT, FLOAT) as
    // two interleaved 16-bit channels.
    //

    int minX = range.min.x;
    int maxX = range.max.x;
    int minY = range.min.y;
    int maxY = range.max.y;
    
    if (maxY > _maxY)
        maxY = _maxY;
    
    if (maxX > _maxX)
        maxX = _maxX;

    unsigned short *tmpBufferEnd = _tmpBuffer;
    int i = 0;

    for (ChannelList::ConstIterator c = _channels.begin();
	 c != _channels.end();
	 ++c, ++i)
    {
	ChannelData &cd = _channelData[i];

	cd.start = tmpBufferEnd;
	cd.end = cd.start;

	cd.nx = numSamples (c.channel().xSampling, minX, maxX);
	cd.ny = numSamples (c.channel().ySampling, minY, maxY);
	cd.ys = c.channel().ySampling;

	cd.size = pixelTypeSize (c.channel().type) / pixelTypeSize (HALF);

	tmpBufferEnd += cd.nx * cd.ny * cd.size;
    }

    if (_format == XDR)
    {
	//
	// Machine-independent (Xdr) data format
	//

	for (int y = minY; y <= maxY; ++y)
	{
	    for (int i = 0; i < _numChans; ++i)
	    {
		ChannelData &cd = _channelData[i];

		if (modp (y, cd.ys) != 0)
		    continue;

		for (int x = cd.nx * cd.size; x > 0; --x)
		{
		    Xdr::read <CharPtrIO> (inPtr, *cd.end);
		    ++cd.end;
		}
	    }
	}
    }
    else
    {
	//
	// Native, machine-dependent data format
	//

	for (int y = minY; y <= maxY; ++y)
	{
	    for (int i = 0; i < _numChans; ++i)
	    {
		ChannelData &cd = _channelData[i];

		if (modp (y, cd.ys) != 0)
		    continue;

		int n = cd.nx * cd.size;
		memcpy (cd.end, inPtr, n * sizeof (unsigned short));
		inPtr  += n * sizeof (unsigned short);
		cd.end += n;
	    }
	}
    }

    #if defined (DEBUG)

	for (int i = 1; i < _numChans; ++i)
	    assert (_channelData[i-1].end == _channelData[i].start);

	assert (_channelData[_numChans-1].end == tmpBufferEnd);

    #endif

    //
    // Compress the range of the pixel data
    //

    AutoArray <unsigned char, BITMAP_SIZE> bitmap;
    unsigned short minNonZero;
    unsigned short maxNonZero;

    bitmapFromData (_tmpBuffer,
		    tmpBufferEnd - _tmpBuffer,
		    bitmap,
		    minNonZero, maxNonZero);

    AutoArray <unsigned short, USHORT_RANGE> lut;
    unsigned short maxValue = forwardLutFromBitmap (bitmap, lut);
    applyLut (lut, _tmpBuffer, tmpBufferEnd - _tmpBuffer);

    //
    // Store range compression info in _outBuffer
    //

    char *buf = _outBuffer;

    Xdr::write <CharPtrIO> (buf, minNonZero);
    Xdr::write <CharPtrIO> (buf, maxNonZero);

    if (minNonZero <= maxNonZero)
    {
	Xdr::write <CharPtrIO> (buf, (char *) &bitmap[0] + minNonZero,
				maxNonZero - minNonZero + 1);
    }

    //
    // Apply wavelet encoding
    //

    for (int i = 0; i < _numChans; ++i)
    {
	ChannelData &cd = _channelData[i];

	for (int j = 0; j < cd.size; ++j)
	{
	    wav2Encode (cd.start + j,
			cd.nx, cd.size,
			cd.ny, cd.nx * cd.size,
			maxValue);
	}
    }

    //
    // Apply Huffman encoding; append the result to _outBuffer
    //

    char *lengthPtr = buf;
    Xdr::write <CharPtrIO> (buf, int(0));

    int length = hufCompress (_tmpBuffer, tmpBufferEnd - _tmpBuffer, buf);
    Xdr::write <CharPtrIO> (lengthPtr, length);

    outPtr = _outBuffer;
    return buf - _outBuffer + length;
}